

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O1

VarSet * __thiscall libDAI::VarSet::operator/=(VarSet *this,Var *n)

{
  pointer __src;
  pointer *ppVVar1;
  pointer pVVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer __dest;
  
  __dest = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)pVVar2 - (long)__dest >> 4;
  if (0 < (long)uVar5) {
    do {
      uVar3 = uVar5 >> 1;
      uVar4 = uVar3;
      if (__dest[uVar3]._label < n->_label) {
        uVar4 = ~uVar3 + uVar5;
        __dest = __dest + uVar3 + 1;
      }
      uVar5 = uVar4;
    } while (0 < (long)uVar4);
  }
  if ((__dest != pVVar2) && (__dest->_label == n->_label)) {
    __src = __dest + 1;
    if (__src != pVVar2) {
      memmove(__dest,__src,(long)pVVar2 - (long)__src);
    }
    ppVVar1 = &(this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + -1;
    this->_statespace = this->_statespace / n->_states;
  }
  return this;
}

Assistant:

VarSet& operator/= ( const Var& n ) { 
                std::vector<Var>::iterator pos = lower_bound( _vars.begin(), _vars.end(), n );
                if( pos != _vars.end() )
                    if( *pos == n ) { // found variable, delete it
                        _vars.erase( pos ); 
                        _statespace /= n.states();
                    }
#ifdef DEBUG
                assert( is_sorted( _vars.begin(), _vars.end() ) );
#endif
                return *this; 
            }